

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

bool __thiscall
Args::CmdLine::isMisspelledName(CmdLine *this,String *name,StringList *possibleNames)

{
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_RDX;
  CmdLine *in_RDI;
  bool ret;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff68;
  anon_class_32_4_d4a081f8 in_stack_ffffffffffffff90;
  byte local_19;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  local_18;
  
  local_19 = 0;
  local_18._M_current = in_RDX;
  arguments(in_RDI);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin(in_stack_ffffffffffffff68);
  arguments(in_RDI);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend(in_stack_ffffffffffffff68);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::isMisspelledName(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)const::_lambda(auto:1_const&)_1_>
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)&local_19,
             local_18,in_stack_ffffffffffffff90);
  return (bool)(local_19 & 1);
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const
	{
		bool ret = false;

		std::for_each( arguments().cbegin(), arguments().cend(),
			[ & ] ( const auto & arg )
			{
				if( arg->type() == ArgType::Command )
				{
					if( arg.get() == m_command )
					{
						if( arg->isMisspelledName( name, possibleNames ) )
							ret = true;
					}
					else if( static_cast< Command* > ( arg.get() )->
						isMisspelledCommand( name, possibleNames ) )
							ret = true;
				}
				else if( arg->isMisspelledName( name, possibleNames ) )
					ret = true;
			} );

		return ret;
	}